

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_content_type.cpp
# Opt level: O0

void __thiscall cppcms::http::content_type::content_type(content_type *this,string *ct)

{
  undefined8 *puVar1;
  char *end;
  char *begin;
  char *in_stack_00000250;
  char *in_stack_00000258;
  content_type *in_stack_00000260;
  data *__p;
  shared_ptr<cppcms::http::content_type::data> *this_00;
  
  puVar1 = (undefined8 *)operator_new(0x90);
  __p = (data *)0x0;
  this_00 = (shared_ptr<cppcms::http::content_type::data> *)0x0;
  puVar1[0x10] = 0;
  puVar1[0x11] = 0;
  puVar1[0xe] = 0;
  puVar1[0xf] = 0;
  puVar1[0xc] = 0;
  puVar1[0xd] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  *puVar1 = 0;
  puVar1[1] = 0;
  data::data((data *)0x0);
  std::shared_ptr<cppcms::http::content_type::data>::
  shared_ptr<cppcms::http::content_type::data,void>(this_00,__p);
  std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  parse(in_stack_00000260,in_stack_00000258,in_stack_00000250);
  return;
}

Assistant:

content_type::content_type(std::string const &ct) :
		d(new content_type::data())
	{
		char const *begin = ct.c_str();
		char const *end = begin + ct.size();
		parse(begin,end);
	}